

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,true>
          (Thread *this)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar1;
  byte local_31;
  undefined2 uStack_30;
  undefined2 uStack_2e;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  u8 i;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  Thread *this_local;
  
  SVar1 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  result.v[4]._0_1_ = SVar1.v[0];
  result.v[4]._1_1_ = SVar1.v[1];
  result.v[5]._0_1_ = SVar1.v[2];
  result.v[5]._1_1_ = SVar1.v[3];
  result.v[6]._0_1_ = SVar1.v[4];
  result.v[6]._1_1_ = SVar1.v[5];
  result.v[7]._0_1_ = SVar1.v[6];
  result.v[7]._1_1_ = SVar1.v[7];
  val.v[0] = SVar1.v[8];
  val.v[1] = SVar1.v[9];
  val.v[2] = SVar1.v[10];
  val.v[3] = SVar1.v[0xb];
  val.v[4] = SVar1.v[0xc];
  val.v[5] = SVar1.v[0xd];
  val.v[6] = SVar1.v[0xe];
  val.v[7] = SVar1.v[0xf];
  for (local_31 = 0; local_31 < 8; local_31 = local_31 + 1) {
    *(ushort *)(val.v + (ulong)local_31 * 2 + -0x18) =
         (ushort)*(byte *)((long)result.v + (long)(int)(uint)local_31 + 8);
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = uStack_30;
  value.v[1] = uStack_2e;
  value.v[2] = uStack_2c;
  value.v[3] = uStack_2a;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}